

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseTerminalBracketsOrUnary(Parser *this)

{
  Allocator *this_00;
  Allocator *pAVar1;
  iterator iVar2;
  LiteralString *pLVar3;
  ostream *poVar4;
  StaticError *pSVar5;
  uint *while_;
  Token *this_01;
  bool got_comma;
  AST *index;
  pointer pFStack_550;
  pointer local_548;
  AST *first;
  Token field_id;
  Identifier *id;
  pointer pCStack_470;
  pointer local_468;
  Fodder id_fodder;
  Token tok;
  AST *obj;
  undefined1 local_348 [384];
  AST *inner;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_1c0 [7];
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_108;
  Token local_f0;
  
  pop(&tok,this);
  while_ = &switchD_001a872a::switchdataD_0022b314;
  switch(tok.kind) {
  case BRACE_L:
    parseObjectRemainder(&local_f0,this,&obj,&tok);
    Token::~Token(&local_f0);
    pLVar3 = (LiteralString *)CONCAT44(obj._4_4_,(int)obj);
    goto LAB_001a8daa;
  case BRACE_R:
  case BRACKET_R:
  case COMMA:
  case DOT:
  case PAREN_R:
  case SEMICOLON:
  case ASSERT:
  case ELSE:
  case ERROR:
  case FOR:
  case FUNCTION:
  case IF:
  case IMPORT:
  case IMPORTSTR:
  case IMPORTBIN:
  case IN:
  case LOCAL:
  case TAILSTRICT:
  case THEN:
    pSVar5 = (StaticError *)__cxa_allocate_exception(0x60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&obj,"parsing terminal",(allocator<char> *)&field_id);
    unexpected(pSVar5,(Parser *)&tok,(Token *)&obj,(string *)while_);
    __cxa_throw(pSVar5,&StaticError::typeinfo,StaticError::~StaticError);
  case BRACKET_L:
    Token::Token(&field_id,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    if (field_id.kind == BRACKET_R) {
      pop((Token *)&obj,this);
      pAVar1 = this->alloc;
      span((LocationRange *)&inner,&tok,&field_id);
      id_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      id_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      id_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      index = (AST *)((ulong)index & 0xffffffffffffff00);
      pLVar3 = (LiteralString *)
               Allocator::
               make<jsonnet::internal::Array,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                         (pAVar1,(LocationRange *)&inner,&tok.fodder,
                          (vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                           *)&id_fodder,(bool *)&index,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)local_348);
      std::
      vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
      ::~vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                 *)&id_fodder);
      std::__cxx11::string::~string((string *)&inner);
      Token::~Token((Token *)&obj);
    }
    else {
      first = parse(this,0xf);
      got_comma = false;
      local_548 = (pointer)0x0;
      index = (AST *)0x0;
      pFStack_550 = (pointer)0x0;
      Token::operator=(&field_id,
                       (Token *)((this->tokens->
                                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                 )._M_impl._M_node.super__List_node_base._M_next + 1));
      if (field_id.kind == COMMA && got_comma == false) {
        pop((Token *)&obj,this);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)&index,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)local_348);
        Token::operator=(&field_id,
                         (Token *)((this->tokens->
                                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                   )._M_impl._M_node.super__List_node_base._M_next + 1));
        got_comma = true;
        Token::~Token((Token *)&obj);
      }
      if (field_id.kind == FOR) {
        pop((Token *)&obj,this);
        id = (Identifier *)0x0;
        pCStack_470 = (pointer)0x0;
        local_468 = (pointer)0x0;
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::vector(&local_108,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)local_348);
        parseComprehensionSpecs
                  ((Token *)&inner,this,BRACKET_R,&local_108,
                   (vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                    *)&id);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_108);
        pAVar1 = this->alloc;
        span((LocationRange *)&id_fodder,&tok,(Token *)&inner);
        pLVar3 = (LiteralString *)
                 Allocator::
                 make<jsonnet::internal::ArrayComprehension,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&,std::vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                           (pAVar1,(LocationRange *)&id_fodder,&tok.fodder,&first,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)&index,&got_comma,
                            (vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                             *)&id,local_1c0);
        std::__cxx11::string::~string((string *)&id_fodder);
        Token::~Token((Token *)&inner);
        std::
        vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ::~vector((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                   *)&id);
        Token::~Token((Token *)&obj);
      }
      else {
        id_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        id_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        id_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
        ::
        emplace_back<jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                  ((vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
                    *)&id_fodder,&first,
                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    *)&index);
        while (field_id.kind != BRACKET_R) {
          if (got_comma == false) {
            std::__cxx11::stringstream::stringstream((stringstream *)&obj);
            std::operator<<((ostream *)(local_348 + 8),"expected a comma before next array element."
                           );
            pSVar5 = (StaticError *)__cxa_allocate_exception(0x60);
            std::__cxx11::stringbuf::str();
            StaticError::StaticError(pSVar5,&field_id.location,(string *)&inner);
            __cxa_throw(pSVar5,&StaticError::typeinfo,StaticError::~StaticError);
          }
          inner = parse(this,0xf);
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::clear((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&index);
          got_comma = false;
          Token::operator=(&field_id,
                           (Token *)((this->tokens->
                                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                     )._M_impl._M_node.super__List_node_base._M_next + 1));
          if (field_id.kind == COMMA) {
            pop((Token *)&obj,this);
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)&index,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)local_348);
            Token::operator=(&field_id,
                             (Token *)((this->tokens->
                                       super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                       )._M_impl._M_node.super__List_node_base._M_next + 1));
            got_comma = true;
            Token::~Token((Token *)&obj);
          }
          std::
          vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
          ::
          emplace_back<jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                    ((vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
                      *)&id_fodder,&inner,
                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      *)&index);
        }
        pop((Token *)&obj,this);
        pAVar1 = this->alloc;
        span((LocationRange *)&inner,&tok,&field_id);
        pLVar3 = (LiteralString *)
                 Allocator::
                 make<jsonnet::internal::Array,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                           (pAVar1,(LocationRange *)&inner,&tok.fodder,
                            (vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                             *)&id_fodder,&got_comma,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)local_348);
        std::__cxx11::string::~string((string *)&inner);
        Token::~Token((Token *)&obj);
        std::
        vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ::~vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                   *)&id_fodder);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&index);
    }
    this_01 = &field_id;
    goto LAB_001a918e;
  case DOLLAR:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Dollar,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder);
    break;
  case PAREN_L:
    inner = parse(this,0xf);
    popExpect((Token *)&obj,this,PAREN_R,(char *)0x0);
    pAVar1 = this->alloc;
    span((LocationRange *)&field_id,&tok,(Token *)&obj);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Parens,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       (pAVar1,(LocationRange *)&field_id,&tok.fodder,&inner,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)local_348);
    std::__cxx11::string::~string((string *)&field_id);
    goto LAB_001a900d;
  case IDENTIFIER:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    this_00 = this->alloc;
    Token::data32_abi_cxx11_((UString *)&field_id,&tok);
    inner = (AST *)Allocator::makeIdentifier(this_00,(UString *)&field_id);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder,(Identifier **)&inner);
    goto LAB_001a8cab;
  case NUMBER:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::string&>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder,&tok.data);
    break;
  case OPERATOR:
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>_>_>
                    *)(anonymous_namespace)::unary_map_abi_cxx11_,&tok.data);
    if (iVar2._M_node == (_Base_ptr)((anonymous_namespace)::unary_map_abi_cxx11_ + 8)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&obj);
      poVar4 = std::operator<<((ostream *)(local_348 + 8),"not a unary operator: ");
      std::operator<<(poVar4,(string *)&tok.data);
      pSVar5 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar5,&tok.location,(string *)&field_id);
      __cxa_throw(pSVar5,&StaticError::typeinfo,StaticError::~StaticError);
    }
    inner = (AST *)CONCAT44(inner._4_4_,iVar2._M_node[2]._M_color);
    field_id._0_8_ = parse(this,4);
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok,(AST *)field_id._0_8_);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Unary,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::UnaryOp&,jsonnet::internal::AST*&>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder,(UnaryOp *)&inner,(AST **)&field_id
                       );
    break;
  case STRING_DOUBLE:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    Token::data32_abi_cxx11_((UString *)&field_id,&tok);
    inner = (AST *)CONCAT44(inner._4_4_,1);
    pLVar3 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)&field_id,(TokenKind *)&inner,(char (*) [1])0x244900,
                        (char (*) [1])0x244900);
    goto LAB_001a8cab;
  case STRING_SINGLE:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    Token::data32_abi_cxx11_((UString *)&field_id,&tok);
    inner = (AST *)((ulong)inner._4_4_ << 0x20);
    pLVar3 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)&field_id,(TokenKind *)&inner,(char (*) [1])0x244900,
                        (char (*) [1])0x244900);
    goto LAB_001a8cab;
  case STRING_BLOCK:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    Token::data32_abi_cxx11_((UString *)&field_id,&tok);
    inner = (AST *)CONCAT44(inner._4_4_,2);
    pLVar3 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,std::__cxx11::string&,std::__cxx11::string&>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)&field_id,(TokenKind *)&inner,&tok.stringBlockIndent,
                        &tok.stringBlockTermIndent);
    goto LAB_001a8cab;
  case VERBATIM_STRING_SINGLE:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    Token::data32_abi_cxx11_((UString *)&field_id,&tok);
    inner = (AST *)CONCAT44(inner._4_4_,3);
    pLVar3 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)&field_id,(TokenKind *)&inner,(char (*) [1])0x244900,
                        (char (*) [1])0x244900);
    goto LAB_001a8cab;
  case VERBATIM_STRING_DOUBLE:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    Token::data32_abi_cxx11_((UString *)&field_id,&tok);
    inner = (AST *)CONCAT44(inner._4_4_,4);
    pLVar3 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)&field_id,(TokenKind *)&inner,(char (*) [1])0x244900,
                        (char (*) [1])0x244900);
LAB_001a8cab:
    std::__cxx11::u32string::~u32string((u32string *)&field_id);
    break;
  case FALSE:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    field_id._0_8_ = field_id._0_8_ & 0xffffffffffffff00;
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralBoolean,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder,(bool *)&field_id);
    break;
  case NULL_LIT:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder);
    break;
  case SELF:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Self,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder);
    break;
  case SUPER:
    pop((Token *)&obj,this);
    index = (AST *)0x0;
    id = (Identifier *)0x0;
    id_fodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    id_fodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    id_fodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((int)obj == 2) {
      index = parse(this,0xf);
      popExpect(&field_id,this,BRACKET_R,(char *)0x0);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&id_fodder,&field_id.fodder);
    }
    else {
      if ((int)obj != 6) {
        pSVar5 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&field_id,"expected . or [ after super.",(allocator<char> *)&inner);
        StaticError::StaticError(pSVar5,&tok.location,(string *)&field_id);
        __cxa_throw(pSVar5,&StaticError::typeinfo,StaticError::~StaticError);
      }
      popExpect(&field_id,this,IDENTIFIER,(char *)0x0);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&id_fodder,&field_id.fodder);
      pAVar1 = this->alloc;
      Token::data32_abi_cxx11_((UString *)&inner,&field_id);
      id = Allocator::makeIdentifier(pAVar1,(UString *)&inner);
      std::__cxx11::u32string::~u32string((u32string *)&inner);
    }
    Token::~Token(&field_id);
    pAVar1 = this->alloc;
    span((LocationRange *)&field_id,&tok);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::SuperIndex,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                       (pAVar1,(LocationRange *)&field_id,&tok.fodder,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)local_348,&index,&id_fodder,&id);
    std::__cxx11::string::~string((string *)&field_id);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&id_fodder);
LAB_001a900d:
    this_01 = (Token *)&obj;
LAB_001a918e:
    Token::~Token(this_01);
    goto LAB_001a8daa;
  case TRUE:
    pAVar1 = this->alloc;
    span((LocationRange *)&obj,&tok);
    field_id.kind._0_1_ = 1;
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralBoolean,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool>
                       (pAVar1,(LocationRange *)&obj,&tok.fodder,(bool *)&field_id);
    break;
  case END_OF_FILE:
    pSVar5 = (StaticError *)__cxa_allocate_exception(0x60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&obj,"unexpected end of file.",(allocator<char> *)&field_id);
    StaticError::StaticError(pSVar5,&tok.location,(string *)&obj);
    __cxa_throw(pSVar5,&StaticError::typeinfo,StaticError::~StaticError);
  default:
    poVar4 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown tok kind: ");
    internal::operator<<(poVar4,tok.kind);
    std::endl<char,std::char_traits<char>>(poVar4);
    abort();
  }
  std::__cxx11::string::~string((string *)&obj);
LAB_001a8daa:
  Token::~Token(&tok);
  return &pLVar3->super_AST;
}

Assistant:

AST *parseTerminalBracketsOrUnary(void)
    {
        Token tok = pop();
        switch (tok.kind) {
            case Token::ASSERT:
            case Token::BRACE_R:
            case Token::BRACKET_R:
            case Token::COMMA:
            case Token::DOT:
            case Token::ELSE:
            case Token::ERROR:
            case Token::FOR:
            case Token::FUNCTION:
            case Token::IF:
            case Token::IN:
            case Token::IMPORT:
            case Token::IMPORTSTR:
            case Token::IMPORTBIN:
            case Token::LOCAL:
            case Token::PAREN_R:
            case Token::SEMICOLON:
            case Token::TAILSTRICT:
            case Token::THEN: throw unexpected(tok, "parsing terminal");

            case Token::END_OF_FILE: throw StaticError(tok.location, "unexpected end of file.");

            case Token::OPERATOR: {
                UnaryOp uop;
                if (!op_is_unary(tok.data, uop)) {
                    std::stringstream ss;
                    ss << "not a unary operator: " << tok.data;
                    throw StaticError(tok.location, ss.str());
                }
                AST *expr = parse(UNARY_PRECEDENCE);
                return alloc->make<Unary>(span(tok, expr), tok.fodder, uop, expr);
            }
            case Token::BRACE_L: {
                AST *obj;
                parseObjectRemainder(obj, tok);
                return obj;
            }

            case Token::BRACKET_L: {
                Token next = peek();
                if (next.kind == Token::BRACKET_R) {
                    Token bracket_r = pop();
                    return alloc->make<Array>(
                        span(tok, next), tok.fodder, Array::Elements{}, false, bracket_r.fodder);
                }
                AST *first = parse(MAX_PRECEDENCE);
                bool got_comma = false;
                Fodder comma_fodder;
                next = peek();
                if (!got_comma && next.kind == Token::COMMA) {
                    Token comma = pop();
                    comma_fodder = comma.fodder;
                    next = peek();
                    got_comma = true;
                }

                if (next.kind == Token::FOR) {
                    // It's a comprehension
                    Token for_token = pop();
                    std::vector<ComprehensionSpec> specs;
                    Token last = parseComprehensionSpecs(Token::BRACKET_R, for_token.fodder, specs);
                    return alloc->make<ArrayComprehension>(span(tok, last),
                                                           tok.fodder,
                                                           first,
                                                           comma_fodder,
                                                           got_comma,
                                                           specs,
                                                           last.fodder);
                }

                // Not a comprehension: It can have more elements.
                Array::Elements elements;
                elements.emplace_back(first, comma_fodder);
                do {
                    if (next.kind == Token::BRACKET_R) {
                        Token bracket_r = pop();
                        return alloc->make<Array>(
                            span(tok, next), tok.fodder, elements, got_comma, bracket_r.fodder);
                    }
                    if (!got_comma) {
                        std::stringstream ss;
                        ss << "expected a comma before next array element.";
                        throw StaticError(next.location, ss.str());
                    }
                    AST *expr = parse(MAX_PRECEDENCE);
                    comma_fodder.clear();
                    got_comma = false;
                    next = peek();
                    if (next.kind == Token::COMMA) {
                        Token comma = pop();
                        comma_fodder = comma.fodder;
                        next = peek();
                        got_comma = true;
                    }
                    elements.emplace_back(expr, comma_fodder);
                } while (true);
            }

            case Token::PAREN_L: {
                auto *inner = parse(MAX_PRECEDENCE);
                Token close = popExpect(Token::PAREN_R);
                return alloc->make<Parens>(span(tok, close), tok.fodder, inner, close.fodder);
            }

            // Literals
            case Token::NUMBER: return alloc->make<LiteralNumber>(span(tok), tok.fodder, tok.data);

            case Token::STRING_SINGLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::SINGLE, "", "");
            case Token::STRING_DOUBLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::DOUBLE, "", "");
            case Token::STRING_BLOCK:
                return alloc->make<LiteralString>(span(tok),
                                                  tok.fodder,
                                                  tok.data32(),
                                                  LiteralString::BLOCK,
                                                  tok.stringBlockIndent,
                                                  tok.stringBlockTermIndent);
            case Token::VERBATIM_STRING_SINGLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::VERBATIM_SINGLE, "", "");
            case Token::VERBATIM_STRING_DOUBLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::VERBATIM_DOUBLE, "", "");

            case Token::FALSE: return alloc->make<LiteralBoolean>(span(tok), tok.fodder, false);

            case Token::TRUE: return alloc->make<LiteralBoolean>(span(tok), tok.fodder, true);

            case Token::NULL_LIT: return alloc->make<LiteralNull>(span(tok), tok.fodder);

            // Variables
            case Token::DOLLAR: return alloc->make<Dollar>(span(tok), tok.fodder);

            case Token::IDENTIFIER:
                return alloc->make<Var>(span(tok), tok.fodder, alloc->makeIdentifier(tok.data32()));

            case Token::SELF: return alloc->make<Self>(span(tok), tok.fodder);

            case Token::SUPER: {
                Token next = pop();
                AST *index = nullptr;
                const Identifier *id = nullptr;
                Fodder id_fodder;
                switch (next.kind) {
                    case Token::DOT: {
                        Token field_id = popExpect(Token::IDENTIFIER);
                        id_fodder = field_id.fodder;
                        id = alloc->makeIdentifier(field_id.data32());
                    } break;
                    case Token::BRACKET_L: {
                        index = parse(MAX_PRECEDENCE);
                        Token bracket_r = popExpect(Token::BRACKET_R);
                        id_fodder = bracket_r.fodder;  // Not id_fodder, but use the same var.
                    } break;
                    default: throw StaticError(tok.location, "expected . or [ after super.");
                }
                return alloc->make<SuperIndex>(
                    span(tok), tok.fodder, next.fodder, index, id_fodder, id);
            }
        }

        std::cerr << "INTERNAL ERROR: Unknown tok kind: " << tok.kind << std::endl;
        std::abort();
        return nullptr;  // Quiet, compiler.
    }